

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string *value)

{
  byte *pbVar1;
  bool bVar2;
  int64 iVar3;
  uint first_byte_or_zero;
  
  pbVar1 = input->buffer_;
  if (pbVar1 < input->buffer_end_) {
    first_byte_or_zero = (uint)*pbVar1;
    if (-1 < (char)*pbVar1) {
      input->buffer_ = pbVar1 + 1;
      bVar2 = true;
      goto LAB_002916cf;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  iVar3 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  first_byte_or_zero = (uint)iVar3;
  bVar2 = -1 < iVar3;
LAB_002916cf:
  if (bVar2) {
    bVar2 = io::CodedInputStream::ReadString(input,value,first_byte_or_zero);
    return bVar2;
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input,
                               std::string* value) {
  return ReadBytesToString(input, value);
}